

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

ProStringList * __thiscall
QMap<ProKey,_ProStringList>::value
          (QMap<ProKey,_ProStringList> *this,ProKey *key,ProStringList *defaultValue)

{
  bool bVar1;
  ProStringList *in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
  *in_stack_ffffffffffffffa8;
  ProStringList *this_00;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                      *)0x17f0f6);
  if (bVar1) {
    local_10._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                  *)0x17f124);
    local_10._M_node =
         (_Base_ptr)
         std::
         map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x17f135);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                  *)0x17f144);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
         ::cend(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (bVar1) {
      std::_Rb_tree_const_iterator<std::pair<const_ProKey,_ProStringList>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_ProKey,_ProStringList>_> *)0x17f174);
      ProStringList::ProStringList(this_00,(ProStringList *)in_stack_ffffffffffffffa8);
    }
    else {
      ProStringList::ProStringList(this_00,(ProStringList *)in_stack_ffffffffffffffa8);
    }
  }
  else {
    ProStringList::ProStringList(this_00,(ProStringList *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }